

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O0

WavFileElement * __thiscall WavFileElement::Flush(WavFileElement *this)

{
  byte_t *pbVar1;
  byte_t *pbVar2;
  uint *puVar3;
  long in_RSI;
  ui32_t write_size;
  ui32_t write_count;
  WavFileElement *this_local;
  
  pbVar2 = *(byte_t **)(in_RSI + 0x60);
  pbVar1 = ASDCP::FrameBuffer::Data((FrameBuffer *)(in_RSI + 0x38));
  if (pbVar2 == pbVar1) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_EMPTY_FB);
  }
  else {
    ASDCP::FrameBuffer::Data((FrameBuffer *)(in_RSI + 0x38));
    pbVar2 = ASDCP::FrameBuffer::Data((FrameBuffer *)(in_RSI + 0x38));
    *(byte_t **)(in_RSI + 0x60) = pbVar2;
    puVar3 = (uint *)ASDCP::FrameBuffer::RoData((FrameBuffer *)(in_RSI + 0x38));
    Kumu::FileWriter::Write((uchar *)this,(uint)in_RSI,puVar3);
  }
  return this;
}

Assistant:

ASDCP::Result_t Flush()
  {
    ui32_t write_count = 0;

    if ( m_p == m_Buf.Data() )
      return ASDCP::RESULT_EMPTY_FB;

    ui32_t write_size = m_p - m_Buf.Data();
    m_p = m_Buf.Data();
    return Write(m_Buf.RoData(), write_size, &write_count);
  }